

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O0

void __thiscall
duckdb::ChimpGroupState<unsigned_int>::LoadFlags
          (ChimpGroupState<unsigned_int> *this,uint8_t *packed_data,idx_t group_size)

{
  uint8_t uVar1;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  uint8_t *in_RSI;
  long in_RDI;
  idx_t i;
  FlagBuffer<false> flag_buffer;
  ulong local_30;
  FlagBuffer<false> local_28;
  ulong local_18;
  uint8_t *local_10;
  
  local_18 = CONCAT71(in_register_00000011,in_DL);
  local_10 = in_RSI;
  FlagBuffer<false>::FlagBuffer(&local_28);
  FlagBuffer<false>::SetBuffer(&local_28,local_10);
  *(undefined1 *)(in_RDI + 8) = 0;
  for (local_30 = 0; local_30 < local_18; local_30 = local_30 + 1) {
    uVar1 = FlagBuffer<false>::Extract(&local_28);
    *(uint8_t *)(in_RDI + local_30 + 9) = uVar1;
  }
  *(ulong *)(in_RDI + 0x2420) = local_18;
  *(undefined8 *)(in_RDI + 0x2410) = 0;
  return;
}

Assistant:

void LoadFlags(uint8_t *packed_data, idx_t group_size) {
		FlagBuffer<false> flag_buffer;
		flag_buffer.SetBuffer(packed_data);
		flags[0] = ChimpConstants::Flags::VALUE_IDENTICAL; // First value doesn't require a flag
		for (idx_t i = 0; i < group_size; i++) {
			flags[1 + i] = (ChimpConstants::Flags)flag_buffer.Extract();
		}
		max_flags_to_read = group_size;
		index = 0;
	}